

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  ulong uVar5;
  ImRect local_18;
  
  pIVar2 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((pIVar4 = GImGui->NavWindow, pIVar4 == (ImGuiWindow *)0x0 || (pIVar4->Appearing == false)))) {
    if ((GImGui->IO).MouseClicked[0] == true) {
      if (GImGui->HoveredRootWindow == (ImGuiWindow *)0x0) {
        if (pIVar4 != (ImGuiWindow *)0x0) {
          pIVar4 = GetFrontMostPopupModal();
          if (pIVar4 == (ImGuiWindow *)0x0) {
            FocusWindow((ImGuiWindow *)0x0);
          }
        }
      }
      else {
        StartMouseMovingWindow(GImGui->HoveredWindow);
        if (((pIVar2->IO).ConfigWindowsMoveFromTitleBarOnly == true) &&
           ((pIVar2->HoveredRootWindow->Flags & 1) == 0)) {
          local_18 = ImGuiWindow::TitleBarRect(pIVar2->HoveredRootWindow);
          bVar3 = ImRect::Contains(&local_18,(pIVar2->IO).MouseClickedPos);
          if (!bVar3) {
            pIVar2->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
      }
    }
    if ((pIVar2->IO).MouseClicked[1] == true) {
      pIVar4 = GetFrontMostPopupModal();
      bVar3 = pIVar4 == (ImGuiWindow *)0x0;
      for (uVar5 = (ulong)(uint)(pIVar2->Windows).Size;
          ((0 < (int)uVar5 && (!bVar3)) &&
          (pIVar1 = (pIVar2->Windows).Data[uVar5 - 1], pIVar1 != pIVar4)); uVar5 = uVar5 - 1) {
        if (pIVar1 == pIVar2->HoveredWindow) {
          bVar3 = true;
        }
      }
      if (bVar3) {
        pIVar4 = pIVar2->HoveredWindow;
      }
      ClosePopupsOverWindow(pIVar4);
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    // Initiate moving window
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click to focus window and start moving (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        if (g.HoveredRootWindow != NULL)
        {
            StartMouseMovingWindow(g.HoveredWindow);
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(g.HoveredRootWindow->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!g.HoveredRootWindow->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;
        }
        else if (g.NavWindow != NULL && GetFrontMostPopupModal() == NULL)
        {
            FocusWindow(NULL);  // Clicking on void disable focus
        }
    }

    // With right mouse button we close popups without changing focus
    // (The left mouse button path calls FocusWindow which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the front most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetFrontMostPopupModal();
        bool hovered_window_above_modal = false;
        if (modal == NULL)
            hovered_window_above_modal = true;
        for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window == modal)
                break;
            if (window == g.HoveredWindow)
                hovered_window_above_modal = true;
        }
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal);
    }
}